

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8 * google::protobuf::internal::InternalSerializeMapEntry
                  (FieldDescriptor *field,MapKey *key,MapValueRef *value,uint8 *target,
                  EpsCopyOutputStream *stream)

{
  FieldDescriptor *pFVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  uint32 uVar5;
  int32 iVar6;
  int iVar7;
  Descriptor *pDVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  LogMessage *other;
  string *psVar12;
  int64 iVar13;
  uint64 uVar14;
  Message *pMVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 *ptr;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  float fVar21;
  double dVar22;
  FieldDescriptor *local_80;
  FieldDescriptor *local_78;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  pDVar8 = FieldDescriptor::message_type(field);
  pFVar1 = *(FieldDescriptor **)(pDVar8 + 0x28);
  pDVar8 = FieldDescriptor::message_type(field);
  lVar2 = *(long *)(pDVar8 + 0x28);
  local_70 = pFVar1;
  sVar9 = MapKeyDataOnlyByteSize(pFVar1,key);
  local_78 = (FieldDescriptor *)(lVar2 + 0x98);
  sVar10 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar2 + 0x98),value);
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  pFVar1 = local_70;
  uVar11 = sVar9 + sVar10 + 2;
  uVar18 = *(int *)(field + 0x44) << 3;
  if (uVar18 < 0x80) {
    *target = (byte)uVar18 | 2;
    pbVar19 = target + 1;
  }
  else {
    *target = (byte)uVar18 | 0x82;
    if (uVar18 < 0x4000) {
      target[1] = (byte)(uVar18 >> 7);
      pbVar19 = target + 2;
    }
    else {
      pbVar19 = target + 2;
      uVar18 = uVar18 >> 7;
      do {
        pbVar20 = pbVar19;
        pbVar20[-1] = (byte)uVar18 | 0x80;
        uVar16 = uVar18 >> 7;
        pbVar19 = pbVar20 + 1;
        bVar4 = 0x3fff < uVar18;
        uVar18 = uVar16;
      } while (bVar4);
      *pbVar20 = (byte)uVar16;
    }
  }
  if ((uint)uVar11 < 0x80) {
    *pbVar19 = (byte)uVar11;
    pbVar19 = pbVar19 + 1;
  }
  else {
    *pbVar19 = (byte)uVar11 | 0x80;
    uVar17 = uVar11 >> 7 & 0x1ffffff;
    if ((uint)uVar11 < 0x4000) {
      pbVar19[1] = (byte)uVar17;
      pbVar19 = pbVar19 + 2;
    }
    else {
      pbVar19 = pbVar19 + 2;
      do {
        pbVar20 = pbVar19;
        uVar18 = (uint)uVar17;
        pbVar20[-1] = (byte)uVar17 | 0x80;
        uVar16 = uVar18 >> 7;
        uVar17 = (ulong)uVar16;
        pbVar19 = pbVar20 + 1;
      } while (0x3fff < uVar18);
      *pbVar20 = (byte)uVar16;
    }
  }
  if (stream->end_ <= pbVar19) {
    pbVar19 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar19);
  }
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_80 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,&local_80
              );
  }
  switch(*(undefined4 *)(pFVar1 + 0x38)) {
  case 1:
  case 2:
  case 10:
  case 0xb:
  case 0xc:
  case 0xe:
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x2ba);
    other = LogMessage::operator<<(&local_68,"Unsupported");
    LogFinisher::operator=((LogFinisher *)&local_80,other);
    LogMessage::~LogMessage(&local_68);
    break;
  case 3:
    uVar14 = MapKey::GetInt64Value(key);
    *pbVar19 = 8;
    if (uVar14 < 0x80) {
LAB_00384d29:
      pbVar19[1] = (byte)uVar14;
      goto LAB_00384d2d;
    }
    pbVar19[1] = (byte)uVar14 | 0x80;
    uVar11 = uVar14 >> 7;
    if (uVar14 < 0x4000) {
LAB_00384d4d:
      pbVar19[2] = (byte)uVar11;
      goto LAB_00384d6c;
    }
    pbVar19 = pbVar19 + 3;
    do {
      pbVar19[-1] = (byte)uVar11 | 0x80;
      uVar17 = uVar11 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar4 = 0x3fff < uVar11;
      uVar11 = uVar17;
    } while (bVar4);
    goto LAB_00384d91;
  case 4:
    uVar14 = MapKey::GetUInt64Value(key);
    *pbVar19 = 8;
    if (uVar14 < 0x80) goto LAB_00384d29;
    pbVar19[1] = (byte)uVar14 | 0x80;
    uVar11 = uVar14 >> 7;
    if (uVar14 < 0x4000) goto LAB_00384d4d;
    pbVar19 = pbVar19 + 3;
    do {
      pbVar19[-1] = (byte)uVar11 | 0x80;
      uVar17 = uVar11 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar4 = 0x3fff < uVar11;
      uVar11 = uVar17;
    } while (bVar4);
    goto LAB_00384d91;
  case 5:
    uVar5 = MapKey::GetInt32Value(key);
    *pbVar19 = 8;
    if (uVar5 < 0x80) {
LAB_00384c87:
      pbVar19[1] = (byte)uVar5;
      goto LAB_00384d2d;
    }
    pbVar19[1] = (byte)uVar5 | 0x80;
    uVar11 = (ulong)(long)(int)uVar5 >> 7;
    if (uVar5 < 0x4000) goto LAB_00384d4d;
    pbVar19 = pbVar19 + 3;
    do {
      pbVar19[-1] = (byte)uVar11 | 0x80;
      uVar17 = uVar11 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar4 = 0x3fff < uVar11;
      uVar11 = uVar17;
    } while (bVar4);
    goto LAB_00384d91;
  case 6:
    uVar14 = MapKey::GetUInt64Value(key);
    goto LAB_00384ba1;
  case 7:
    uVar5 = MapKey::GetUInt32Value(key);
    goto LAB_00384cfb;
  case 8:
    bVar4 = MapKey::GetBoolValue(key);
    *pbVar19 = 8;
    pbVar19[1] = bVar4;
LAB_00384d2d:
    pbVar19 = pbVar19 + 2;
    break;
  case 9:
    psVar12 = MapKey::GetStringValue_abi_cxx11_(key);
    sVar3 = psVar12->_M_string_length;
    if (((long)sVar3 < 0x80) && ((long)sVar3 <= (long)(stream->end_ + (0xe - (long)pbVar19)))) {
      *pbVar19 = 10;
      pbVar19[1] = (byte)sVar3;
      memcpy(pbVar19 + 2,(psVar12->_M_dataplus)._M_p,sVar3);
      pbVar19 = pbVar19 + sVar3 + 2;
    }
    else {
      pbVar19 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,psVar12,pbVar19);
    }
    break;
  case 0xd:
    uVar5 = MapKey::GetUInt32Value(key);
    *pbVar19 = 8;
    if (uVar5 < 0x80) goto LAB_00384c87;
    pbVar19[1] = (byte)uVar5 | 0x80;
    uVar16 = uVar5 >> 7;
    if (uVar5 < 0x4000) goto LAB_00384d68;
    pbVar19 = pbVar19 + 3;
    do {
      pbVar19[-1] = (byte)uVar16 | 0x80;
      uVar18 = uVar16 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar4 = 0x3fff < uVar16;
      uVar16 = uVar18;
    } while (bVar4);
LAB_00384db3:
    pbVar19[-1] = (byte)uVar18;
    break;
  case 0xf:
    uVar5 = MapKey::GetInt32Value(key);
LAB_00384cfb:
    *pbVar19 = 0xd;
    *(uint32 *)(pbVar19 + 1) = uVar5;
    pbVar19 = pbVar19 + 5;
    break;
  case 0x10:
    uVar14 = MapKey::GetInt64Value(key);
LAB_00384ba1:
    *pbVar19 = 9;
    *(uint64 *)(pbVar19 + 1) = uVar14;
    pbVar19 = pbVar19 + 9;
    break;
  case 0x11:
    iVar6 = MapKey::GetInt32Value(key);
    *pbVar19 = 8;
    uVar18 = iVar6 >> 0x1f ^ iVar6 * 2;
    uVar14 = (uint64)uVar18;
    if (uVar18 < 0x80) goto LAB_00384d29;
    pbVar19[1] = (byte)uVar18 | 0x80;
    uVar16 = uVar18 >> 7;
    if (0x3fff < uVar18) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar16 | 0x80;
        uVar18 = uVar16 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar16;
        uVar16 = uVar18;
      } while (bVar4);
      goto LAB_00384db3;
    }
LAB_00384d68:
    pbVar19[2] = (byte)uVar16;
LAB_00384d6c:
    pbVar19 = pbVar19 + 3;
    break;
  case 0x12:
    iVar13 = MapKey::GetInt64Value(key);
    *pbVar19 = 8;
    uVar14 = iVar13 >> 0x3f ^ iVar13 * 2;
    if (uVar14 < 0x80) goto LAB_00384d29;
    pbVar19[1] = (byte)uVar14 | 0x80;
    uVar11 = uVar14 >> 7;
    if (uVar14 < 0x4000) goto LAB_00384d4d;
    pbVar19 = pbVar19 + 3;
    do {
      pbVar19[-1] = (byte)uVar11 | 0x80;
      uVar17 = uVar11 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar4 = 0x3fff < uVar11;
      uVar11 = uVar17;
    } while (bVar4);
LAB_00384d91:
    pbVar19[-1] = (byte)uVar17;
  }
  if (stream->end_ <= pbVar19) {
    pbVar19 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar19);
  }
  if (*(once_flag **)(lVar2 + 200) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_80 = local_78;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(lVar2 + 200),(_func_void_FieldDescriptor_ptr **)&local_68,&local_80);
  }
  switch(*(undefined4 *)(lVar2 + 0xd0)) {
  case 1:
    dVar22 = MapValueRef::GetDoubleValue(value);
    *pbVar19 = 0x11;
    *(double *)(pbVar19 + 1) = dVar22;
    goto LAB_003850f8;
  case 2:
    fVar21 = MapValueRef::GetFloatValue(value);
    *pbVar19 = 0x15;
    *(float *)(pbVar19 + 1) = fVar21;
    goto LAB_0038514f;
  case 3:
    uVar11 = MapValueRef::GetInt64Value(value);
    *pbVar19 = 0x10;
    if (uVar11 < 0x80) goto LAB_003850ba;
    pbVar19[1] = (byte)uVar11 | 0x80;
    uVar17 = uVar11 >> 7;
    if (0x3fff < uVar11) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar17 | 0x80;
        uVar11 = uVar17 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar17;
        uVar17 = uVar11;
      } while (bVar4);
LAB_0038524a:
      pbVar19[-1] = (byte)uVar11;
      return pbVar19;
    }
    goto LAB_003851cb;
  case 4:
    uVar11 = MapValueRef::GetUInt64Value(value);
    *pbVar19 = 0x10;
    if (uVar11 < 0x80) goto LAB_003850ba;
    pbVar19[1] = (byte)uVar11 | 0x80;
    uVar17 = uVar11 >> 7;
    if (0x3fff < uVar11) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar17 | 0x80;
        uVar11 = uVar17 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar17;
        uVar17 = uVar11;
      } while (bVar4);
      goto LAB_0038524a;
    }
    goto LAB_003851cb;
  case 5:
    uVar5 = MapValueRef::GetInt32Value(value);
    *pbVar19 = 0x10;
    if (uVar5 < 0x80) {
LAB_003850d8:
      pbVar19[1] = (byte)uVar5;
      goto LAB_003850dc;
    }
    pbVar19[1] = (byte)uVar5 | 0x80;
    uVar17 = (ulong)(long)(int)uVar5 >> 7;
    if (0x3fff < uVar5) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar17 | 0x80;
        uVar11 = uVar17 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar17;
        uVar17 = uVar11;
      } while (bVar4);
      goto LAB_0038524a;
    }
    goto LAB_003851cb;
  case 6:
    uVar14 = MapValueRef::GetUInt64Value(value);
    goto LAB_003850ef;
  case 7:
    uVar5 = MapValueRef::GetUInt32Value(value);
    goto LAB_00385146;
  case 8:
    bVar4 = MapValueRef::GetBoolValue(value);
    *pbVar19 = 0x10;
    pbVar19[1] = bVar4;
    goto LAB_003850dc;
  case 9:
  case 0xc:
    psVar12 = MapValueRef::GetStringValue_abi_cxx11_(value);
    sVar3 = psVar12->_M_string_length;
    if (((long)sVar3 < 0x80) && ((long)sVar3 <= (long)(stream->end_ + (0xe - (long)pbVar19)))) {
      *pbVar19 = 0x12;
      pbVar19[1] = (byte)sVar3;
      memcpy(pbVar19 + 2,(psVar12->_M_dataplus)._M_p,sVar3);
      pbVar19 = pbVar19 + sVar3 + 2;
    }
    else {
      pbVar19 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,psVar12,pbVar19);
    }
    break;
  case 10:
    pMVar15 = MapValueRef::GetMessageValue(value);
    *pbVar19 = 0x13;
    iVar7 = (*(pMVar15->super_MessageLite)._vptr_MessageLite[0xe])(pMVar15,pbVar19 + 1,stream);
    ptr = (uint8 *)CONCAT44(extraout_var,iVar7);
    if (stream->end_ <= ptr) {
      ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    }
    *ptr = '\x14';
    pbVar19 = ptr + 1;
    break;
  case 0xb:
    pMVar15 = MapValueRef::GetMessageValue(value);
    *pbVar19 = 0x12;
    uVar18 = (*(pMVar15->super_MessageLite)._vptr_MessageLite[0xc])(pMVar15);
    if (uVar18 < 0x80) {
      pbVar19[1] = (byte)uVar18;
      pbVar19 = pbVar19 + 2;
    }
    else {
      pbVar19[1] = (byte)uVar18 | 0x80;
      if (uVar18 < 0x4000) {
        pbVar19[2] = (byte)(uVar18 >> 7);
        pbVar19 = pbVar19 + 3;
      }
      else {
        pbVar19 = pbVar19 + 3;
        uVar18 = uVar18 >> 7;
        do {
          pbVar20 = pbVar19;
          pbVar20[-1] = (byte)uVar18 | 0x80;
          uVar16 = uVar18 >> 7;
          pbVar19 = pbVar20 + 1;
          bVar4 = 0x3fff < uVar18;
          uVar18 = uVar16;
        } while (bVar4);
        *pbVar20 = (byte)uVar16;
      }
    }
    iVar7 = (*(pMVar15->super_MessageLite)._vptr_MessageLite[0xe])(pMVar15,pbVar19,stream);
    pbVar19 = (byte *)CONCAT44(extraout_var_00,iVar7);
    break;
  case 0xd:
    uVar5 = MapValueRef::GetUInt32Value(value);
    *pbVar19 = 0x10;
    if (uVar5 < 0x80) goto LAB_003850d8;
    pbVar19[1] = (byte)uVar5 | 0x80;
    uVar16 = uVar5 >> 7;
    if (0x3fff < uVar5) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar16 | 0x80;
        uVar18 = uVar16 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar16;
        uVar16 = uVar18;
      } while (bVar4);
LAB_00385225:
      pbVar19[-1] = (byte)uVar18;
      return pbVar19;
    }
LAB_00384f2c:
    pbVar19[2] = (byte)uVar16;
    goto LAB_003851cf;
  case 0xe:
    uVar5 = MapValueRef::GetEnumValue(value);
    *pbVar19 = 0x10;
    if (uVar5 < 0x80) goto LAB_003850d8;
    pbVar19[1] = (byte)uVar5 | 0x80;
    uVar17 = (ulong)(long)(int)uVar5 >> 7;
    if (0x3fff < uVar5) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar17 | 0x80;
        uVar11 = uVar17 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar17;
        uVar17 = uVar11;
      } while (bVar4);
      goto LAB_0038524a;
    }
    goto LAB_003851cb;
  case 0xf:
    uVar5 = MapValueRef::GetInt32Value(value);
LAB_00385146:
    *pbVar19 = 0x15;
    *(uint32 *)(pbVar19 + 1) = uVar5;
LAB_0038514f:
    pbVar19 = pbVar19 + 5;
    break;
  case 0x10:
    uVar14 = MapValueRef::GetInt64Value(value);
LAB_003850ef:
    *pbVar19 = 0x11;
    *(uint64 *)(pbVar19 + 1) = uVar14;
LAB_003850f8:
    pbVar19 = pbVar19 + 9;
    break;
  case 0x11:
    iVar6 = MapValueRef::GetInt32Value(value);
    *pbVar19 = 0x10;
    uVar18 = iVar6 >> 0x1f ^ iVar6 * 2;
    uVar11 = (ulong)uVar18;
    if (0x7f < uVar18) {
      pbVar19[1] = (byte)uVar18 | 0x80;
      uVar16 = uVar18 >> 7;
      if (0x3fff < uVar18) {
        pbVar19 = pbVar19 + 3;
        do {
          pbVar19[-1] = (byte)uVar16 | 0x80;
          uVar18 = uVar16 >> 7;
          pbVar19 = pbVar19 + 1;
          bVar4 = 0x3fff < uVar16;
          uVar16 = uVar18;
        } while (bVar4);
        goto LAB_00385225;
      }
      goto LAB_00384f2c;
    }
LAB_003850ba:
    pbVar19[1] = (byte)uVar11;
LAB_003850dc:
    pbVar19 = pbVar19 + 2;
    break;
  case 0x12:
    iVar13 = MapValueRef::GetInt64Value(value);
    *pbVar19 = 0x10;
    uVar11 = iVar13 >> 0x3f ^ iVar13 * 2;
    if (uVar11 < 0x80) goto LAB_003850ba;
    pbVar19[1] = (byte)uVar11 | 0x80;
    uVar17 = uVar11 >> 7;
    if (0x3fff < uVar11) {
      pbVar19 = pbVar19 + 3;
      do {
        pbVar19[-1] = (byte)uVar17 | 0x80;
        uVar11 = uVar17 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar4 = 0x3fff < uVar17;
        uVar17 = uVar11;
      } while (bVar4);
      goto LAB_0038524a;
    }
LAB_003851cb:
    pbVar19[2] = (byte)uVar17;
LAB_003851cf:
    pbVar19 = pbVar19 + 3;
  }
  return pbVar19;
}

Assistant:

static uint8* InternalSerializeMapEntry(const FieldDescriptor* field,
                                        const MapKey& key,
                                        const MapValueRef& value, uint8* target,
                                        io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  stream->EnsureSpace(&target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}